

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O0

void test_cipher_caesar_parse_key(void)

{
  byte bVar1;
  uint local_24;
  undefined2 uStack_1e;
  _Bool success;
  uint key;
  undefined2 local_18;
  char text4 [3];
  char text3 [3];
  char text2 [3];
  char text [13];
  
  text4[1] = 'I';
  text4[2] = 'n';
  text3[0] = 'v';
  text3[1] = 'a';
  text3[2] = 'l';
  text2[0] = 'i';
  text2[1] = 'd';
  text2[2] = ' ';
  local_18 = 0x3231;
  text4[0] = '\0';
  key._1_2_ = 0x3632;
  key._3_1_ = 0;
  uStack_1e = 0x3732;
  key._0_1_ = 0;
  local_24 = 0;
  bVar1 = caesar_parse_key(text4 + 1,&local_24);
  UnityAssertEqualNumber(0,(ulong)(bVar1 & 1),(char *)0x0,0x65,UNITY_DISPLAY_STYLE_INT);
  bVar1 = caesar_parse_key(&local_18,&local_24);
  UnityAssertEqualNumber(1,(ulong)(bVar1 & 1),(char *)0x0,0x68,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0xc,(ulong)local_24,(char *)0x0,0x69,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key((long)&key + 1,&local_24);
  UnityAssertEqualNumber(1,(ulong)(bVar1 & 1),(char *)0x0,0x6c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0x1a,(ulong)local_24,(char *)0x0,0x6d,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key(&stack0xffffffffffffffe2,&local_24);
  UnityAssertEqualNumber(0,(ulong)(bVar1 & 1),(char *)0x0,0x6f,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

void test_cipher_caesar_parse_key(void)
{
	char text[] = "Invalid key!";
	char text2[] = "12";
	char text3[] = "26";
	char text4[] = "27";

	unsigned int key = 0;
	bool success;

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text, &key));

	success = caesar_parse_key(text2, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(12, key);

	success = caesar_parse_key(text3, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(26, key);

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text4, &key));
}